

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ap.c
# Opt level: O3

int main(int argc,char **argv)

{
  byte bVar1;
  char cVar2;
  long lVar3;
  bool bVar4;
  FILE *__stream;
  uint uVar5;
  int iVar6;
  AP_LOG_LEVEL AVar7;
  size_t sVar8;
  char *pcVar9;
  FILE *file;
  undefined8 *puVar10;
  char *pcVar11;
  char *pcVar12;
  char *ip_str;
  ulong uVar13;
  uint uVar14;
  long *plVar15;
  BOOL BVar16;
  char **ppcVar17;
  uint32_t network;
  uint32_t ip;
  AP_CTX local_498;
  uint local_458;
  uint local_454;
  char *local_450;
  char *local_448;
  ulong local_440;
  char *local_438 [129];
  
  if (argv == (char **)0x0) {
    main_cold_12();
    uVar5 = 3;
  }
  else {
    local_498.client_ip = (char *)0x0;
    local_498.client_command = (char *)0x0;
    local_498.log_file = (FILE *)0x0;
    local_498.simulate = '\0';
    local_498._41_7_ = 0;
    local_498.config_file = (FILE *)0x0;
    local_498.log_path = (char *)0x0;
    local_498.default_dir = (char *)0x0;
    local_498.config_path = (char *)0x0;
    ap_log_init();
    if (argc == 1) goto LAB_0010258b;
    if (argc == 0) {
      main_cold_9();
    }
    else {
      if (argc < 9) {
        pcVar11 = argv[1];
        if (pcVar11 == (char *)0x0) {
LAB_0010258b:
          uVar5 = get_default_directory(&local_498);
          pcVar11 = local_498.default_dir;
          if ((uVar5 == 0) && (uVar5 = create_directory(local_498.default_dir), uVar5 == 0)) {
            sVar8 = strlen(pcVar11);
            sVar8 = sVar8 + 0x11;
            pcVar9 = (char *)calloc(1,sVar8);
            local_498.log_path = pcVar9;
            if (pcVar9 == (char *)0x0) {
              main_cold_11();
              uVar5 = 4;
              goto LAB_001029e0;
            }
            ap_str_strlcpy(pcVar9,pcVar11,sVar8);
            ap_str_strlcat(pcVar9,"/",sVar8);
            ap_str_strlcat(pcVar9,"authprogs.log",sVar8);
            goto LAB_0010261b;
          }
LAB_001025ac:
          uVar14 = 0;
          if (uVar5 < 3) goto LAB_00102a02;
          goto LAB_001029e0;
        }
        ppcVar17 = argv + 1;
        pcVar9 = (char *)0x0;
        BVar16 = '\0';
        do {
          if (*pcVar11 != '-') goto switchD_001024b4_caseD_64;
          bVar1 = pcVar11[1];
          if (bVar1 - 99 < 10) {
            pcVar12 = ppcVar17[1];
            switch((uint)bVar1) {
            case 99:
              if (pcVar11[2] == '\0') {
                if (pcVar12 == (char *)0x0) {
LAB_00102988:
                  pcVar9 = "\'%s\' requires an argument\n";
                  pcVar12 = pcVar11;
                  goto LAB_001029c5;
                }
                local_498.config_path = strdup(pcVar12);
                if (local_498.config_path != (char *)0x0) {
LAB_0010256d:
                  ppcVar17 = ppcVar17 + 2;
                  goto LAB_00102571;
                }
                main_cold_7();
LAB_00102a49:
                uVar5 = 4;
                goto LAB_001029d6;
              }
              break;
            case 0x65:
              if (pcVar11[2] == '\0') {
                if (pcVar12 == (char *)0x0) goto LAB_00102988;
                sVar8 = strlen(pcVar12);
                if ((sVar8 == 1) && (0xf9 < (byte)(*pcVar12 - 0x36U))) {
                  ap_log_set_level((uint)(byte)(*pcVar12 - 0x30));
                  goto LAB_0010256d;
                }
                pcVar9 = "Invalid log level \'%s\'\n";
LAB_001029c5:
                local_498.simulate = BVar16;
                fprintf(_stdout,pcVar9,pcVar12);
                show_help();
                goto LAB_001029d1;
              }
              break;
            case 0x68:
              local_498.simulate = BVar16;
              if (pcVar11[2] != '\0') goto LAB_00102928;
              show_help();
              uVar14 = 0;
              goto LAB_00102a02;
            case 0x6c:
              if (pcVar11[2] == '\0') {
                if (pcVar12 == (char *)0x0) goto LAB_00102988;
                pcVar9 = strdup(pcVar12);
                local_498.log_path = pcVar9;
                if (pcVar9 != (char *)0x0) goto LAB_0010256d;
                main_cold_6();
                goto LAB_00102a49;
              }
            }
switchD_001024b4_caseD_64:
LAB_00102928:
            local_498.simulate = BVar16;
            main_cold_5();
            goto LAB_001029d1;
          }
          if (bVar1 != 0x73) {
            if (bVar1 != 0x76) goto switchD_001024b4_caseD_64;
            local_498.simulate = BVar16;
            if (pcVar11[2] != '\0') goto LAB_00102928;
            uVar14 = 0;
            fprintf(_stdout,"\nauthprogs %d.%d.%d\n",0,9,0xc9);
            goto LAB_00102a02;
          }
          if (pcVar11[2] != '\0') goto switchD_001024b4_caseD_64;
          ppcVar17 = ppcVar17 + 1;
          BVar16 = '\x01';
LAB_00102571:
          pcVar11 = *ppcVar17;
        } while (pcVar11 != (char *)0x0);
        local_498.simulate = BVar16;
        if (pcVar9 == (char *)0x0) goto LAB_0010258b;
LAB_0010261b:
        iVar6 = strcmp(pcVar9,"stdout");
        if (iVar6 == 0) {
          puVar10 = (undefined8 *)&stdout;
LAB_00102682:
          file = (FILE *)*puVar10;
        }
        else {
          iVar6 = strcmp(pcVar9,"stderr");
          if (iVar6 == 0) {
            puVar10 = (undefined8 *)&stderr;
            goto LAB_00102682;
          }
          file = fopen(pcVar9,"at");
          local_498.log_file = (FILE *)file;
          if (file == (FILE *)0x0) {
            main_cold_10();
            uVar5 = 8;
            goto LAB_001029e0;
          }
        }
        ap_log_set_output((FILE *)file);
        local_438[0] = (char *)0x0;
        pcVar11 = getenv("SSH_CLIENT");
        if (pcVar11 == (char *)0x0) {
          main_cold_4();
LAB_00102972:
          uVar5 = 6;
        }
        else {
          if (*pcVar11 == '\0') {
            main_cold_3();
            goto LAB_00102972;
          }
          pcVar11 = strdup(pcVar11);
          local_498.client_ip = pcVar11;
          if (pcVar11 != (char *)0x0) {
            pcVar9 = strtok_r(pcVar11," \t",local_438);
            if (pcVar9 != (char *)0x0) {
              local_438[0] = (char *)0x0;
              pcVar9 = getenv("SSH_ORIGINAL_COMMAND");
              uVar5 = 6;
              if (pcVar9 == (char *)0x0) {
                pcVar9 = "(%s) Can not get SSH_ORIGINAL_COMMAND environment variable\n";
              }
              else if (*pcVar9 == '\0') {
                pcVar9 = "(%s) Empty SSH_ORIGINAL_COMMAND environment variable\n";
              }
              else {
                ap_log(AP_LOG_LEVEL_DEBUG,"(%s) Client command \'%s\'\n",pcVar11,pcVar9);
                AVar7 = ap_log_get_level();
                if (AVar7 == AP_LOG_LEVEL_TRACE) {
                  uVar5 = ap_str_to_hex(pcVar9,local_438);
                  if (uVar5 != 0) goto LAB_001025ac;
                  ap_log(AP_LOG_LEVEL_TRACE,"(%s) Client command in hexadecimal \'%s\'\n",pcVar11,
                         local_438[0]);
                  free(local_438[0]);
                }
                pcVar9 = strdup(pcVar9);
                local_498.client_command = pcVar9;
                if (pcVar9 != (char *)0x0) {
                  ap_str_trim_head_from_set(pcVar9," \t");
                  ap_str_trim_tail_from_set(pcVar9," \t\r\n");
                  ap_str_shrink_spaces(pcVar9);
                  uVar5 = init_config_path(&local_498);
                  if ((uVar5 == 0) && (uVar5 = open_config(&local_498), uVar5 == 0)) {
                    AVar7 = ap_log_get_level();
                    pcVar11 = local_498.client_ip;
                    if (AVar7 == AP_LOG_LEVEL_TRACE) {
                      if (_environ == (long *)0x0) {
                        pcVar9 = "(%s) Can not get environment\n";
                      }
                      else {
                        pcVar9 = "(%s) +------------------------------------+\n";
                        ap_log(AP_LOG_LEVEL_TRACE,"(%s) +------------------------------------+\n",
                               local_498.client_ip);
                        ap_log(AP_LOG_LEVEL_TRACE,"(%s) |          ENVIRONMENT START         |\n",
                               pcVar11);
                        ap_log(AP_LOG_LEVEL_TRACE,"(%s) +------------------------------------+\n",
                               pcVar11);
                        lVar3 = *_environ;
                        plVar15 = _environ;
                        while (lVar3 != 0) {
                          plVar15 = plVar15 + 1;
                          ap_log(AP_LOG_LEVEL_TRACE,"(%s) | %s\n",pcVar11);
                          lVar3 = *plVar15;
                        }
                        ap_log(AP_LOG_LEVEL_TRACE,"(%s) +------------------------------------+\n",
                               pcVar11);
                        ap_log(AP_LOG_LEVEL_TRACE,"(%s) |          ENVIRONMENT END           |\n",
                               pcVar11);
                      }
                      ap_log(AP_LOG_LEVEL_TRACE,pcVar9,pcVar11);
                    }
                    __stream = local_498.config_file;
                    pcVar12 = fgets((char *)local_438,0x400,(FILE *)local_498.config_file);
                    pcVar9 = local_498.client_command;
                    if (pcVar12 != (char *)0x0) {
                      bVar4 = false;
                      do {
                        pcVar12 = ap_str_trim_head_from_set((char *)local_438," \t");
                        ap_str_trim_tail_from_set(pcVar12," \t\r\n");
                        ap_str_shrink_spaces(pcVar12);
                        ap_log(AP_LOG_LEVEL_DEBUG,"(%s) Parsing line \'%s\'\n",pcVar11,pcVar12);
                        sVar8 = strlen(pcVar12);
                        cVar2 = *pcVar12;
                        if ((cVar2 != '#') && (sVar8 != 0 && cVar2 != ';')) {
                          if (cVar2 == '[') {
                            if (pcVar12[sVar8 - 1] == ']') {
                              local_450 = (char *)0x0;
                              sVar8 = strlen(pcVar12);
                              pcVar12[sVar8 - 1] = '\0';
                              pcVar12 = ap_str_trim_from_set(pcVar12 + 1," \t");
                              ap_log(AP_LOG_LEVEL_DEBUG,"(%s) Parsing ip list \'%s\'\n",pcVar11,
                                     pcVar12);
                              pcVar12 = strtok_r(pcVar12," \t",&local_450);
                              while (bVar4 = false, pcVar12 != (char *)0x0) {
                                ap_log(AP_LOG_LEVEL_DEBUG,"(%s) Token \'%s\'\n",pcVar11,pcVar12);
                                ap_log(AP_LOG_LEVEL_DEBUG,"(%s) IP \'%s\'\n",pcVar11,pcVar12);
                                if (((*pcVar12 == 'A') && (pcVar12[1] == 'L')) &&
                                   (pcVar12[2] == 'L')) {
LAB_00102d74:
                                  ap_log(AP_LOG_LEVEL_DEBUG,"(%s) IP match\n",pcVar11);
                                  bVar4 = true;
                                  break;
                                }
                                local_448 = (char *)0x0;
                                ip_str = strtok_r(pcVar12,"/",&local_448);
                                if (ip_str == (char *)0x0) {
                                  ap_log(AP_LOG_LEVEL_ERROR,"(%s) Invalid network address \'%s\'\n",
                                         pcVar11,pcVar12);
                                  uVar5 = 0xd;
                                  goto LAB_001025ac;
                                }
                                pcVar12 = strtok_r((char *)0x0,"/",&local_448);
                                if (pcVar12 == (char *)0x0) {
                                  pcVar12 = "32";
                                }
                                uVar13 = strtoul(pcVar12,(char **)0x0,10);
                                if (0x20 < uVar13) {
                                  ap_log(AP_LOG_LEVEL_ERROR,"(%s) Invalid prefix \'%s\'\n",pcVar11,
                                         pcVar12);
                                  uVar5 = 0xe;
                                  goto LAB_001025ac;
                                }
                                local_440 = uVar13;
                                uVar5 = ip_str_to_ip(&local_498,pcVar11,&local_454);
                                if ((uVar5 != 0) ||
                                   (uVar5 = ip_str_to_ip(&local_498,ip_str,&local_458), uVar5 != 0))
                                goto LAB_001025ac;
                                uVar5 = -1 << (-(char)local_440 & 0x1fU);
                                if (local_440 == 0) {
                                  uVar5 = 0;
                                }
                                if (((local_458 & uVar5) <= local_454) &&
                                   (local_454 <= (local_458 | ~uVar5))) goto LAB_00102d74;
                                ap_log(AP_LOG_LEVEL_DEBUG,"(%s) IP doesn\'t match\n",pcVar11);
                                pcVar12 = strtok_r((char *)0x0," \t",&local_450);
                              }
                            }
                          }
                          else if ((bVar4) && (pcVar12[sVar8 - 1] != ']')) {
                            iVar6 = ap_str_match(pcVar9,pcVar12,";{}|`()&");
                            if (iVar6 == 0x10) {
                              ap_log(AP_LOG_LEVEL_DEBUG,
                                     "(%s) Invalid characters \'%s\' in command \'%s\', not allowed in the substring matched by \'*\'\n"
                                     ,pcVar11,";{}|`()&",pcVar9);
                            }
                            else {
                              if (iVar6 == 0) {
                                uVar14 = 0;
                                ap_log(AP_LOG_LEVEL_DEBUG,
                                       "(%s) Command matched by config line \'%s\'\n",pcVar11,
                                       pcVar12);
                                if (local_498.simulate == '\0') {
                                  uVar5 = system(pcVar9);
                                  if (uVar5 == 0xffffffff) {
                                    pcVar12 = "(%s) Can not execute the shell for command \'%s\'\n";
                                  }
                                  else {
                                    uVar14 = uVar5 >> 8 & 0xff;
                                    if (uVar14 != 0x7f) {
                                      uVar13 = (ulong)uVar14;
                                      goto LAB_00102e84;
                                    }
                                    pcVar12 = 
                                    "(%s) Can not execute command, shell was executed, but the command inside the shell wasn\'t \'%s\'\n"
                                    ;
                                  }
                                  ap_log(AP_LOG_LEVEL_ERROR,pcVar12,pcVar11,pcVar9);
                                  uVar5 = 10;
                                  goto LAB_001029e0;
                                }
                                uVar13 = 0;
LAB_00102e84:
                                ap_log(AP_LOG_LEVEL_ALLOWED_COMMAND,
                                       "(%s) Successfully executed command \'%s\', exit code \'%d\'\n"
                                       ,pcVar11,pcVar9,uVar13);
                                goto LAB_00102a02;
                              }
                              ap_log(AP_LOG_LEVEL_DEBUG,"(%s) Command doesn\'t match\n",pcVar11);
                            }
                          }
                        }
                        pcVar12 = fgets((char *)local_438,0x400,(FILE *)__stream);
                      } while (pcVar12 != (char *)0x0);
                    }
                    uVar14 = 0;
                    ap_log(AP_LOG_LEVEL_DENIED_COMMAND,
                           "(%s) Is not allowed to execute command \'%s\'\n",pcVar11,pcVar9);
                    fprintf(_stderr,"(%s) Is not allowed to execute command \'%s\'\n",pcVar11,pcVar9
                           );
                    goto LAB_00102a02;
                  }
                  goto LAB_001025ac;
                }
                pcVar9 = "(%s) Can not allocate memory for \'ctx->client_command\'\n";
                uVar5 = 4;
              }
              ap_log(AP_LOG_LEVEL_ERROR,pcVar9,pcVar11);
              goto LAB_001025ac;
            }
            main_cold_1();
            goto LAB_00102972;
          }
          main_cold_2();
          uVar5 = 4;
        }
        if (local_498.client_ip != (char *)0x0) {
          free(local_498.client_ip);
        }
        goto LAB_001029e0;
      }
      main_cold_8();
    }
LAB_001029d1:
    uVar5 = 5;
LAB_001029d6:
    uninit(&local_498);
  }
LAB_001029e0:
  uVar14 = uVar5;
  fwrite("authprogs denied your access, please check the log on server (default: \'~/.ssh/authprogs.log\')\n"
         ,0x5f,1,_stderr);
LAB_00102a02:
  uninit(&local_498);
  return uVar14;
}

Assistant:

int main (int argc, char *argv[])
{
	int				rc							= AP_NO_ERROR;
	AP_CTX			ctx;
	BOOL			ip_command_match			= FALSE;
	int				exit_code;
	BOOL			exit_code_set				= FALSE;
	
	if (argv == NULL)
	{
		fprintf (stdout, "Invalid argument: argv\n");
		rc = AP_ERROR_INVALID_ARGUMENT;

		goto finish;
	}

	memset (&ctx, 0, sizeof (AP_CTX));

	rc = init (&ctx, argc, argv);
	if (rc != AP_NO_ERROR)
	{	
		goto finish;
	}

	if (ap_log_get_level () == AP_LOG_LEVEL_TRACE)
	{
		print_environment (&ctx);
	}
	
	rc = parse_config (&ctx, &ip_command_match);
	if (rc != AP_NO_ERROR)
	{
		goto finish;
	}
	
	if (ip_command_match == TRUE)
	{
		rc = run_command (&ctx, &exit_code);
		if (rc != AP_NO_ERROR)
		{
			goto finish;
		}

		exit_code_set = TRUE;
	}
	else
	{
		ap_denied ("(%s) Is not allowed to execute command '%s'\n", ctx.client_ip, ctx.client_command);
		fprintf (stderr, "(%s) Is not allowed to execute command '%s'\n", ctx.client_ip, ctx.client_command);
	}
	
finish:
	if (rc == AP_NO_ERROR)
	{
		if (exit_code_set == TRUE)
		{
			rc = exit_code;
		}
	}
	else
	{
		if (rc == AP_ERROR_VERSION || rc == AP_ERROR_HELP)
		{
			rc = AP_NO_ERROR;
		}
		else
		{
			fprintf (stderr, "authprogs denied your access, please check the log on server (default: '~/.ssh/authprogs.log')\n");
		}
	}

	uninit (&ctx);

	return rc;
}